

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable-file-dialogs.h
# Opt level: O0

void __thiscall pfd::settings::settings(settings *this,bool resync)

{
  byte bVar1;
  bool bVar2;
  bool *pbVar3;
  byte in_SIL;
  string desktop_name;
  regex match_no;
  string pfd_verbose;
  undefined8 in_stack_fffffffffffffd68;
  flag in_flag;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  allocator *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  undefined8 in_stack_fffffffffffffda0;
  flag_type __f;
  char *in_stack_fffffffffffffda8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffdb0;
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [32];
  internal local_148 [32];
  string *in_stack_fffffffffffffed8;
  settings *in_stack_fffffffffffffee0;
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [87];
  allocator local_51;
  string local_50 [32];
  internal local_30 [39];
  byte local_9;
  
  __f = (flag_type)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  local_9 = in_SIL & 1;
  bVar1 = local_9 ^ 0xff;
  in_flag = (flag)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  pbVar3 = flags((settings *)in_stack_fffffffffffffd70,in_flag);
  *pbVar3 = (*pbVar3 & 1U & bVar1 & 1) != 0;
  pbVar3 = flags((settings *)in_stack_fffffffffffffd70,in_flag);
  if ((*pbVar3 & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"PFD_VERBOSE",&local_51);
    internal::getenv(local_30,(char *)local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,__f);
    bVar2 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (in_stack_fffffffffffffd80,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                       (match_flag_type)((ulong)in_stack_fffffffffffffd70 >> 0x20));
    if (!bVar2) {
      pbVar3 = flags((settings *)in_stack_fffffffffffffd70,in_flag);
      *pbVar3 = true;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"zenity",&local_a9);
    bVar2 = check_program(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    pbVar3 = flags((settings *)in_stack_fffffffffffffd70,in_flag);
    *pbVar3 = bVar2;
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"matedialog",&local_d1);
    bVar2 = check_program(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    pbVar3 = flags((settings *)in_stack_fffffffffffffd70,in_flag);
    *pbVar3 = bVar2;
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"qarma",&local_f9);
    bVar2 = check_program(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    pbVar3 = flags((settings *)in_stack_fffffffffffffd70,in_flag);
    *pbVar3 = bVar2;
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffee0,"kdialog",(allocator *)&stack0xfffffffffffffedf);
    bVar2 = check_program(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    pbVar3 = flags((settings *)in_stack_fffffffffffffd70,in_flag);
    *pbVar3 = bVar2;
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
    pbVar3 = flags((settings *)in_stack_fffffffffffffd70,in_flag);
    if (((*pbVar3 & 1U) != 0) &&
       (pbVar3 = flags((settings *)in_stack_fffffffffffffd70,in_flag), (*pbVar3 & 1U) != 0)) {
      paVar4 = &local_169;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_168,"XDG_SESSION_DESKTOP",paVar4);
      internal::getenv(local_148,(char *)local_168);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190,"gnome",&local_191);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                              in_stack_fffffffffffffd88);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      if ((bVar1 & 1) == 0) {
        paVar4 = &local_1b9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1b8,"KDE",paVar4);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(bVar1,in_stack_fffffffffffffd90),in_stack_fffffffffffffd88
                               );
        std::__cxx11::string::~string(local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
        if ((bVar1 & 1) != 0) {
          in_stack_fffffffffffffd70 =
               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               flags((settings *)in_stack_fffffffffffffd70,in_flag);
          *(bool *)&in_stack_fffffffffffffd70->_M_flags = false;
        }
      }
      else {
        pbVar3 = flags((settings *)in_stack_fffffffffffffd70,in_flag);
        *pbVar3 = false;
      }
      std::__cxx11::string::~string((string *)local_148);
    }
    pbVar3 = flags((settings *)in_stack_fffffffffffffd70,in_flag);
    *pbVar3 = true;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              (in_stack_fffffffffffffd70);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

inline settings::settings(bool resync)
{
    flags(flag::is_scanned) &= !resync;

    if (flags(flag::is_scanned))
        return;

    auto pfd_verbose = internal::getenv("PFD_VERBOSE");
    auto match_no = std::regex("(|0|no|false)", std::regex_constants::icase);
    if (!std::regex_match(pfd_verbose, match_no))
        flags(flag::is_verbose) = true;

#if _WIN32
    flags(flag::is_vista) = internal::is_vista();
#elif !__APPLE__
    flags(flag::has_zenity) = check_program("zenity");
    flags(flag::has_matedialog) = check_program("matedialog");
    flags(flag::has_qarma) = check_program("qarma");
    flags(flag::has_kdialog) = check_program("kdialog");

    // If multiple helpers are available, try to default to the best one
    if (flags(flag::has_zenity) && flags(flag::has_kdialog))
    {
        auto desktop_name = internal::getenv("XDG_SESSION_DESKTOP");
        if (desktop_name == std::string("gnome"))
            flags(flag::has_kdialog) = false;
        else if (desktop_name == std::string("KDE"))
            flags(flag::has_zenity) = false;
    }
#endif

    flags(flag::is_scanned) = true;
}